

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::EventFunctionChecker::visit(EventFunctionChecker *this,Processor *p)

{
  Identifier IVar1;
  pointer pbVar2;
  bool bVar3;
  pool_ref<soul::AST::EndpointDeclaration> *ppVar4;
  EndpointDeclaration *pEVar5;
  reference this_00;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *this_01;
  reference this_02;
  StructDeclaration *pSVar6;
  reference this_03;
  UsingDeclaration *pUVar7;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this_04;
  Function *pFVar8;
  size_type sVar9;
  reference pvVar10;
  VariableDeclaration *pVVar11;
  Function *pFVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Identifier *args;
  undefined1 auVar13 [16];
  CompileMessage local_3d0;
  CompileMessage local_398;
  string local_360;
  CompileMessage local_340;
  ArrayView<soul::Type> local_308;
  CompileMessage local_2f8;
  undefined1 local_2c0 [8];
  vector<soul::Type,_std::allocator<soul::Type>_> types_1;
  Type local_290;
  undefined1 local_278 [8];
  Type eventType_1;
  Type local_248;
  undefined1 local_230 [8];
  Type indexType;
  CompileMessage local_1f8;
  ArrayView<soul::Type> local_1c0;
  undefined1 local_1b0 [8];
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  Type local_180;
  undefined1 local_168 [8];
  Type eventType;
  EndpointDetails *details;
  pool_ref<soul::AST::EndpointDeclaration> *e_1;
  pool_ref<soul::AST::EndpointDeclaration> *__end4;
  pool_ref<soul::AST::EndpointDeclaration> *__begin4;
  pool_ref<soul::AST::EndpointDeclaration> *local_128;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *local_120;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range4;
  reference ppStack_110;
  bool nameFound;
  pool_ref<soul::AST::Function> *f;
  iterator __end2_4;
  iterator __begin2_4;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range2_4;
  pool_ref<soul::AST::UsingDeclaration> *u;
  iterator __end2_3;
  iterator __begin2_3;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *__range2_3;
  pool_ref<soul::AST::StructDeclaration> *s;
  iterator __end2_2;
  iterator __begin2_2;
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *__range2_2;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pool_ref<soul::AST::EndpointDeclaration> *__end2;
  pool_ref<soul::AST::EndpointDeclaration> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> local_48;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *local_38;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range2;
  DuplicateNameChecker duplicateNameChecker;
  Processor *p_local;
  EventFunctionChecker *this_local;
  
  duplicateNameChecker.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p;
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  soul::DuplicateNameChecker::DuplicateNameChecker((DuplicateNameChecker *)&__range2);
  local_48 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>)
             (**(code **)(*(long *)duplicateNameChecker.names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40))();
  local_38 = &local_48;
  __end2 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin(local_38);
  ppVar4 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end(local_38);
  for (; __end2 != ppVar4; __end2 = __end2 + 1) {
    pEVar5 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end2);
    IVar1.name = (pEVar5->name).name;
    pEVar5 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end2);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,&(pEVar5->super_ASTObject).context);
  }
  pbVar2 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 10;
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                      *)&pbVar2->field_2);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             *)&pbVar2->field_2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                        *)&v);
    if (!bVar3) break;
    this_00 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
              ::operator*(&__end2_1);
    pVVar11 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_00);
    IVar1.name = (pVVar11->name).name;
    pVVar11 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_00);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pVVar11->super_Statement).super_ASTObject.context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2_1);
  }
  this_01 = (vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
             *)((long)&duplicateNameChecker.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4].field_2 + 8);
  __end2_2 = std::
             vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
             ::begin(this_01);
  s = (pool_ref<soul::AST::StructDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
      ::end(this_01);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
                        *)&s);
    if (!bVar3) break;
    this_02 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
              ::operator*(&__end2_2);
    pSVar6 = pool_ref<soul::AST::StructDeclaration>::operator->(this_02);
    IVar1.name = (pSVar6->super_TypeDeclarationBase).name.name;
    pSVar6 = pool_ref<soul::AST::StructDeclaration>::operator->(this_02);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pSVar6->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
                .context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::StructDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>_>
    ::operator++(&__end2_2);
  }
  pbVar2 = duplicateNameChecker.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3;
  __end2_3 = std::
             vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             ::begin((vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                      *)&pbVar2->_M_string_length);
  u = (pool_ref<soul::AST::UsingDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
      ::end((vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             *)&pbVar2->_M_string_length);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
                        *)&u);
    if (!bVar3) break;
    this_03 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
              ::operator*(&__end2_3);
    pUVar7 = pool_ref<soul::AST::UsingDeclaration>::operator->(this_03);
    IVar1.name = (pUVar7->super_TypeDeclarationBase).name.name;
    pUVar7 = pool_ref<soul::AST::UsingDeclaration>::operator->(this_03);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pUVar7->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
                .context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
    ::operator++(&__end2_3);
  }
  this_04 = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             *)((long)&duplicateNameChecker.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[9].field_2 + 8);
  __end2_4 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::begin(this_04);
  f = (pool_ref<soul::AST::Function> *)
      std::
      vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      ::end(this_04);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2_4,
                       (__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                        *)&f);
    if (!bVar3) {
      soul::DuplicateNameChecker::~DuplicateNameChecker((DuplicateNameChecker *)&__range2);
      return;
    }
    ppStack_110 = __gnu_cxx::
                  __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                  ::operator*(&__end2_4);
    pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
    bVar3 = AST::Function::isEventFunction(pFVar8);
    if (bVar3) {
      __range4._7_1_ = 0;
      auVar13 = (**(code **)(*(long *)duplicateNameChecker.names.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40))();
      local_128 = auVar13._8_8_;
      args_1 = auVar13._0_8_;
      local_120 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)&__begin4;
      __begin4 = (pool_ref<soul::AST::EndpointDeclaration> *)args_1;
      __end4 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin(local_120);
      ppVar4 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end(local_120);
      for (; __end4 != ppVar4; __end4 = __end4 + 1) {
        pEVar5 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end4);
        if ((pEVar5->isInput & 1U) != 0) {
          pEVar5 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end4);
          pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
          bVar3 = Identifier::operator==(&pEVar5->name,&pFVar8->name);
          if (bVar3) {
            __range4._7_1_ = 1;
            pEVar5 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end4);
            eventType.structure.object = (Structure *)AST::EndpointDeclaration::getDetails(pEVar5);
            bVar3 = pool_ptr<soul::AST::Expression>::operator==
                              ((pool_ptr<soul::AST::Expression> *)
                               ((eventType.structure.object)->members).space,(void *)0x0);
            if (bVar3) {
              pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
              sVar9 = std::
                      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                      ::size(&pFVar8->parameters);
              if (sVar9 == 1) {
                pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
                pvVar10 = std::
                          vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                          ::front(&pFVar8->parameters);
                pVVar11 = pool_ref<soul::AST::VariableDeclaration>::operator->(pvVar10);
                AST::VariableDeclaration::getType
                          ((Type *)&types.
                                    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,pVVar11);
                Type::removeConstIfPresent
                          (&local_180,
                           (Type *)&types.
                                    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                Type::removeReferenceIfPresent((Type *)local_168,&local_180);
                Type::~Type(&local_180);
                Type::~Type((Type *)&types.
                                     super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
                AST::EndpointDetails::getResolvedDataTypes
                          ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_1b0,
                           (EndpointDetails *)eventType.structure.object);
                ArrayView<soul::Type>::ArrayView<std::vector<soul::Type,std::allocator<soul::Type>>>
                          (&local_1c0,(vector<soul::Type,_std::allocator<soul::Type>_> *)local_1b0);
                bVar3 = Type::isPresentIn((Type *)local_168,local_1c0);
                if (!bVar3) {
                  pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
                  pFVar12 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
                  Type::getDescription_abi_cxx11_((string *)&indexType.structure,(Type *)local_168);
                  Errors::eventFunctionInvalidType<soul::Identifier&,std::__cxx11::string>
                            (&local_1f8,(Errors *)&pFVar12->name,(Identifier *)&indexType.structure,
                             args_1);
                  AST::Context::throwError(&(pFVar8->super_ASTObject).context,&local_1f8,false);
                }
                std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                          ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_1b0);
                Type::~Type((Type *)local_168);
                goto LAB_00494954;
              }
            }
            bVar3 = pool_ptr<soul::AST::Expression>::operator!=
                              ((pool_ptr<soul::AST::Expression> *)
                               ((eventType.structure.object)->members).space,(void *)0x0);
            if (!bVar3) {
LAB_004948f7:
              pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
              Errors::eventFunctionInvalidArguments<>();
              AST::Context::throwError(&(pFVar8->super_ASTObject).context,&local_398,false);
            }
            pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
            sVar9 = std::
                    vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                    ::size(&pFVar8->parameters);
            if (sVar9 != 2) goto LAB_004948f7;
            pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
            pvVar10 = std::
                      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                      ::front(&pFVar8->parameters);
            pVVar11 = pool_ref<soul::AST::VariableDeclaration>::operator->(pvVar10);
            AST::VariableDeclaration::getType((Type *)&eventType_1.structure,pVVar11);
            Type::removeConstIfPresent(&local_248,(Type *)&eventType_1.structure);
            Type::removeReferenceIfPresent((Type *)local_230,&local_248);
            Type::~Type(&local_248);
            Type::~Type((Type *)&eventType_1.structure);
            pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
            pvVar10 = std::
                      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                      ::back(&pFVar8->parameters);
            pVVar11 = pool_ref<soul::AST::VariableDeclaration>::operator->(pvVar10);
            AST::VariableDeclaration::getType
                      ((Type *)&types_1.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,pVVar11);
            Type::removeConstIfPresent
                      (&local_290,
                       (Type *)&types_1.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            Type::removeReferenceIfPresent((Type *)local_278,&local_290);
            Type::~Type(&local_290);
            Type::~Type((Type *)&types_1.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            AST::EndpointDetails::getResolvedDataTypes
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_2c0,
                       (EndpointDetails *)eventType.structure.object);
            bVar3 = Type::isInteger((Type *)local_230);
            if (!bVar3) {
              pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
              Errors::eventFunctionIndexInvalid<>();
              AST::Context::throwError(&(pFVar8->super_ASTObject).context,&local_2f8,false);
            }
            ArrayView<soul::Type>::ArrayView<std::vector<soul::Type,std::allocator<soul::Type>>>
                      (&local_308,(vector<soul::Type,_std::allocator<soul::Type>_> *)local_2c0);
            bVar3 = Type::isPresentIn((Type *)local_278,local_308);
            if (!bVar3) {
              pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
              pFVar12 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
              Type::getDescription_abi_cxx11_(&local_360,(Type *)local_278);
              Errors::eventFunctionInvalidType<soul::Identifier&,std::__cxx11::string>
                        (&local_340,(Errors *)&pFVar12->name,(Identifier *)&local_360,args_1);
              AST::Context::throwError(&(pFVar8->super_ASTObject).context,&local_340,false);
            }
            std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)local_2c0);
            Type::~Type((Type *)local_278);
            Type::~Type((Type *)local_230);
          }
        }
LAB_00494954:
      }
      if ((__range4._7_1_ & 1) == 0) {
        pFVar8 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
        pFVar12 = pool_ref<soul::AST::Function>::operator->(ppStack_110);
        Errors::noSuchInputEvent<soul::Identifier&>(&local_3d0,(Errors *)&pFVar12->name,args);
        AST::Context::throwError(&(pFVar8->super_ASTObject).context,&local_3d0,false);
      }
    }
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
    ::operator++(&__end2_4);
  } while( true );
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& e : p.getEndpoints())   duplicateNameChecker.check (e->name, e->context);
            for (auto& v : p.stateVariables)   duplicateNameChecker.check (v->name, v->context);
            for (auto& s : p.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : p.usings)           duplicateNameChecker.check (u->name, u->context);

            // (functions must be scanned last)
            for (auto& f : p.functions)
            {
                if (f->isEventFunction())
                {
                    bool nameFound = false;

                    for (auto& e : p.getEndpoints())
                    {
                        if (e->isInput && e->name == f->name)
                        {
                            nameFound = true;
                            const auto& details = e->getDetails();

                            if (details.arraySize == nullptr && f->parameters.size() == 1)
                            {
                                auto eventType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! eventType.isPresentIn (types))
                                    f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else if (details.arraySize != nullptr && f->parameters.size() == 2)
                            {
                                auto indexType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto eventType = f->parameters.back()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! indexType.isInteger())
                                    f->context.throwError (Errors::eventFunctionIndexInvalid());

                               if (! eventType.isPresentIn (types))
                                   f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else
                            {
                                f->context.throwError (Errors::eventFunctionInvalidArguments());
                            }
                        }
                   }

                    if (! nameFound)
                        f->context.throwError (Errors::noSuchInputEvent (f->name));
                }
            }
        }